

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticPropsCmd.cpp
# Opt level: O0

void clear_args(gengetopt_args_info *args_info)

{
  gengetopt_args_info *args_info_local;
  
  args_info->input_arg = (char *)0x0;
  args_info->input_orig = (char *)0x0;
  args_info->output_arg = (char *)0x0;
  args_info->output_orig = (char *)0x0;
  args_info->step_arg = 1;
  args_info->step_orig = (char *)0x0;
  args_info->nbins_arg = 100;
  args_info->nbins_orig = (char *)0x0;
  args_info->nbins_x_arg = 100;
  args_info->nbins_x_orig = (char *)0x0;
  args_info->nbins_y_arg = 100;
  args_info->nbins_y_orig = (char *)0x0;
  args_info->nbins_z_arg = 100;
  args_info->nbins_z_orig = (char *)0x0;
  args_info->nrbins_arg = 100;
  args_info->nrbins_orig = (char *)0x0;
  args_info->binWidth_arg = 1.0;
  args_info->binWidth_orig = (char *)0x0;
  args_info->nanglebins_arg = 0x32;
  args_info->nanglebins_orig = (char *)0x0;
  args_info->rcut_orig = (char *)0x0;
  args_info->OOcut_arg = 3.5;
  args_info->OOcut_orig = (char *)0x0;
  args_info->thetacut_arg = 30.0;
  args_info->thetacut_orig = (char *)0x0;
  args_info->OHcut_arg = 2.45;
  args_info->OHcut_orig = (char *)0x0;
  args_info->dz_orig = (char *)0x0;
  args_info->length_orig = (char *)0x0;
  args_info->zlength_orig = (char *)0x0;
  args_info->zoffset_arg = 0.0;
  args_info->zoffset_orig = (char *)0x0;
  args_info->sele1_arg = (char *)0x0;
  args_info->sele1_orig = (char *)0x0;
  args_info->sele2_arg = (char *)0x0;
  args_info->sele2_orig = (char *)0x0;
  args_info->sele3_arg = (char *)0x0;
  args_info->sele3_orig = (char *)0x0;
  args_info->refsele_arg = (char *)0x0;
  args_info->refsele_orig = (char *)0x0;
  args_info->comsele_arg = (char *)0x0;
  args_info->comsele_orig = (char *)0x0;
  args_info->seleoffset_orig = (char *)0x0;
  args_info->seleoffset2_orig = (char *)0x0;
  args_info->molname_arg = (char *)0x0;
  args_info->molname_orig = (char *)0x0;
  args_info->begin_orig = (char *)0x0;
  args_info->end_orig = (char *)0x0;
  args_info->radius_orig = (char *)0x0;
  args_info->voxelSize_orig = (char *)0x0;
  args_info->gaussWidth_orig = (char *)0x0;
  args_info->privilegedAxis_arg = privilegedAxis_arg_z;
  args_info->privilegedAxis_orig = (char *)0x0;
  args_info->privilegedAxis2_arg = privilegedAxis2_arg_x;
  args_info->privilegedAxis2_orig = (char *)0x0;
  args_info->momentum_arg = momentum_arg_P;
  args_info->momentum_orig = (char *)0x0;
  args_info->component_arg = component_arg_z;
  args_info->component_orig = (char *)0x0;
  args_info->dipoleX_orig = (char *)0x0;
  args_info->dipoleY_orig = (char *)0x0;
  args_info->dipoleZ_orig = (char *)0x0;
  args_info->v_radius_orig = (char *)0x0;
  args_info->gen_xyz_flag = 0;
  args_info->atom_name_arg = (char *)0x0;
  args_info->atom_name_orig = (char *)0x0;
  return;
}

Assistant:

static
void clear_args (struct gengetopt_args_info *args_info)
{
  FIX_UNUSED (args_info);
  args_info->input_arg = NULL;
  args_info->input_orig = NULL;
  args_info->output_arg = NULL;
  args_info->output_orig = NULL;
  args_info->step_arg = 1;
  args_info->step_orig = NULL;
  args_info->nbins_arg = 100;
  args_info->nbins_orig = NULL;
  args_info->nbins_x_arg = 100;
  args_info->nbins_x_orig = NULL;
  args_info->nbins_y_arg = 100;
  args_info->nbins_y_orig = NULL;
  args_info->nbins_z_arg = 100;
  args_info->nbins_z_orig = NULL;
  args_info->nrbins_arg = 100;
  args_info->nrbins_orig = NULL;
  args_info->binWidth_arg = 1.0;
  args_info->binWidth_orig = NULL;
  args_info->nanglebins_arg = 50;
  args_info->nanglebins_orig = NULL;
  args_info->rcut_orig = NULL;
  args_info->OOcut_arg = 3.5;
  args_info->OOcut_orig = NULL;
  args_info->thetacut_arg = 30;
  args_info->thetacut_orig = NULL;
  args_info->OHcut_arg = 2.45;
  args_info->OHcut_orig = NULL;
  args_info->dz_orig = NULL;
  args_info->length_orig = NULL;
  args_info->zlength_orig = NULL;
  args_info->zoffset_arg = 0;
  args_info->zoffset_orig = NULL;
  args_info->sele1_arg = NULL;
  args_info->sele1_orig = NULL;
  args_info->sele2_arg = NULL;
  args_info->sele2_orig = NULL;
  args_info->sele3_arg = NULL;
  args_info->sele3_orig = NULL;
  args_info->refsele_arg = NULL;
  args_info->refsele_orig = NULL;
  args_info->comsele_arg = NULL;
  args_info->comsele_orig = NULL;
  args_info->seleoffset_orig = NULL;
  args_info->seleoffset2_orig = NULL;
  args_info->molname_arg = NULL;
  args_info->molname_orig = NULL;
  args_info->begin_orig = NULL;
  args_info->end_orig = NULL;
  args_info->radius_orig = NULL;
  args_info->voxelSize_orig = NULL;
  args_info->gaussWidth_orig = NULL;
  args_info->privilegedAxis_arg = privilegedAxis_arg_z;
  args_info->privilegedAxis_orig = NULL;
  args_info->privilegedAxis2_arg = privilegedAxis2_arg_x;
  args_info->privilegedAxis2_orig = NULL;
  args_info->momentum_arg = momentum_arg_P;
  args_info->momentum_orig = NULL;
  args_info->component_arg = component_arg_z;
  args_info->component_orig = NULL;
  args_info->dipoleX_orig = NULL;
  args_info->dipoleY_orig = NULL;
  args_info->dipoleZ_orig = NULL;
  args_info->v_radius_orig = NULL;
  args_info->gen_xyz_flag = 0;
  args_info->atom_name_arg = NULL;
  args_info->atom_name_orig = NULL;
  
}